

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall argstest::Command::Command(Command *this)

{
  function<bool_(const_argstest::Group_&)> local_50;
  string local_30;
  Command *local_10;
  Command *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)&local_30);
  std::function<bool(argstest::Group_const&)>::function<bool(&)(argstest::Group_const&),void>
            ((function<bool(argstest::Group_const&)> *)&local_50,Group::Validators::DontCare);
  Group::Group(&this->super_Group,&local_30,&local_50,None);
  std::function<bool_(const_argstest::Group_&)>::~function(&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Group).super_Base._vptr_Base = (_func_int **)&PTR__Command_003693a8;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->help);
  std::__cxx11::string::string((string *)&this->description);
  std::__cxx11::string::string((string *)&this->epilog);
  std::__cxx11::string::string((string *)&this->proglinePostfix);
  std::function<void_(argstest::Subparser_&)>::function(&this->parserCoroutine);
  this->commandIsRequired = true;
  this->selectedCommand = (Command *)0x0;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&this->subparserDescription);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->subparserProgramLine);
  this->subparserHasFlag = false;
  this->subparserHasPositional = false;
  this->subparserHasCommand = false;
  this->subparserError = None;
  this->subparser = (Subparser *)0x0;
  return;
}

Assistant:

Command() = default;